

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

char * cs_md5(char *buf,...)

{
  byte bVar1;
  char in_AL;
  void **ppvVar2;
  void **ppvVar3;
  long lVar4;
  uint uVar5;
  undefined8 in_RCX;
  ulong uVar6;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  uchar hash [16];
  MD5_CTX ctx;
  void **local_150;
  byte local_138 [24];
  undefined1 local_120 [96];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Da;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_120._0_4_ = 0x67452301;
  local_120._4_4_ = 0xefcdab89;
  local_120._8_4_ = 0x98badcfe;
  local_120._12_4_ = 0x10325476;
  local_120._16_4_ = 0;
  local_120._20_4_ = 0;
  uVar5 = 8;
  local_150 = &ap[0].overflow_arg_area;
  local_c0 = in_RSI;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  while( true ) {
    uVar6 = (ulong)uVar5;
    if (uVar6 < 0x29) {
      uVar5 = uVar5 + 8;
      ppvVar2 = (void **)(local_120 + uVar6 + 0x58);
    }
    else {
      ppvVar2 = local_150;
      local_150 = local_150 + 1;
    }
    if (*ppvVar2 == (void *)0x0) break;
    uVar6 = (ulong)uVar5;
    if (uVar6 < 0x29) {
      uVar5 = uVar5 + 8;
      ppvVar3 = (void **)(local_120 + uVar6 + 0x58);
    }
    else {
      ppvVar3 = local_150;
      local_150 = local_150 + 1;
    }
    MD5_Update((MD5_CTX *)local_120,*ppvVar2,(size_t)*ppvVar3);
  }
  MD5_Final(local_138,(MD5_CTX *)local_120);
  lVar4 = 0;
  do {
    bVar1 = local_138[lVar4];
    buf[lVar4 * 2] = "0123456789abcdef"[bVar1 >> 4];
    buf[lVar4 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  buf[0x20] = '\0';
  return buf;
}

Assistant:

char *cs_md5(char buf[33], ...) {
    unsigned char hash[16];
    const unsigned char *p;
    va_list ap;
    MD5_CTX ctx;

    MD5_Init(&ctx);

    va_start(ap, buf);
    while ((p = va_arg(ap, const unsigned char *)) != NULL) {
        size_t len = va_arg(ap, size_t);
        MD5_Update(&ctx, p, len);
    }
    va_end(ap);

    MD5_Final(hash, &ctx);
    cs_to_hex(buf, hash, sizeof(hash));

    return buf;
}